

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedSnapshotRecord.cpp
# Opt level: O0

Entry * __thiscall
cali::CompressedSnapshotRecordView::unpack_next_entry
          (Entry *__return_storage_ptr__,CompressedSnapshotRecordView *this,
          CaliperMetadataAccessInterface *c,size_t *n,size_t *pos)

{
  int iVar1;
  uint64_t uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Attribute local_48;
  undefined1 local_40 [8];
  Variant data;
  cali_id_t id;
  size_t *pos_local;
  size_t *n_local;
  CaliperMetadataAccessInterface *c_local;
  CompressedSnapshotRecordView *this_local;
  
  if (*n == 0) {
    *pos = 1;
  }
  if (*n < this->m_num_nodes) {
    *n = *n + 1;
    uVar2 = vldec_u64(this->m_buffer + *pos,pos);
    iVar1 = (**c->_vptr_CaliperMetadataAccessInterface)(c,uVar2);
    Entry::Entry(__return_storage_ptr__,(Node *)CONCAT44(extraout_var,iVar1));
  }
  else {
    if (*n == this->m_num_nodes) {
      *pos = this->m_imm_pos + 1;
    }
    if (*n < this->m_num_nodes + this->m_num_imm) {
      *n = *n + 1;
      data.m_v.value.v_uint = vldec_u64(this->m_buffer + *pos,pos);
      _local_40 = (cali_variant_t)Variant::unpack(this->m_buffer + *pos,pos,(bool *)0x0);
      iVar1 = (*c->_vptr_CaliperMetadataAccessInterface[1])(c,data.m_v.value.v_uint);
      local_48.m_node = (Node *)CONCAT44(extraout_var_00,iVar1);
      Entry::Entry(__return_storage_ptr__,&local_48,(Variant *)local_40);
    }
    else {
      Entry::Entry(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Entry CompressedSnapshotRecordView::unpack_next_entry(const CaliperMetadataAccessInterface* c, size_t& n, size_t& pos)
{
    if (n == 0)
        pos = 1;

    if (n < m_num_nodes) {
        ++n;
        return Entry(c->node(vldec_u64(m_buffer + pos, &pos)));
    }

    if (n == m_num_nodes)
        pos = m_imm_pos + 1;

    if (n < m_num_nodes + m_num_imm) {
        ++n;

        cali_id_t id   = vldec_u64(m_buffer + pos, &pos);
        Variant   data = Variant::unpack(m_buffer + pos, &pos, nullptr);

        return Entry(c->get_attribute(id), data);
    }

    return Entry();
}